

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_splitter.c
# Opt level: O0

void BrotliSplitBlockCommandsFromStored
               (MemoryManager *m,Command_conflict *cmds,size_t num_commands,size_t pos,size_t mask,
               BlockSplit *cmd_split,BlockSplitFromDecoder *cmd_split_decoder,
               size_t *cur_block_decoder)

{
  uint32_t uVar1;
  byte bVar2;
  byte bVar3;
  void *pvVar4;
  long lVar5;
  uint32_t *local_b8;
  uint32_t *local_b0;
  uint8_t *local_a8;
  uint8_t *local_a0;
  Command_conflict cmd;
  int i_1;
  int i;
  int *types_mapping;
  size_t cur_length;
  size_t cur_pos;
  uint32_t *new_array_1;
  size_t _new_size_1;
  uint8_t *new_array;
  size_t _new_size;
  BlockSplit *cmd_split_local;
  size_t mask_local;
  size_t pos_local;
  size_t num_commands_local;
  Command_conflict *cmds_local;
  MemoryManager *m_local;
  
  if (cmd_split->types_alloc_size < cmd_split_decoder->num_blocks) {
    if (cmd_split->types_alloc_size == 0) {
      local_a0 = (uint8_t *)cmd_split_decoder->num_blocks;
    }
    else {
      local_a0 = (uint8_t *)cmd_split->types_alloc_size;
    }
    for (new_array = local_a0; new_array < (uint8_t *)cmd_split_decoder->num_blocks;
        new_array = (uint8_t *)((long)new_array << 1)) {
    }
    if (new_array == (uint8_t *)0x0) {
      local_a8 = (uint8_t *)0x0;
    }
    else {
      local_a8 = (uint8_t *)BrotliAllocate(m,(size_t)new_array);
    }
    if (cmd_split->types_alloc_size != 0) {
      memcpy(local_a8,cmd_split->types,cmd_split->types_alloc_size);
    }
    BrotliFree(m,cmd_split->types);
    cmd_split->types = (uint8_t *)0x0;
    cmd_split->types = local_a8;
    cmd_split->types_alloc_size = (size_t)new_array;
  }
  if (cmd_split->lengths_alloc_size < cmd_split_decoder->num_blocks) {
    if (cmd_split->lengths_alloc_size == 0) {
      local_b0 = (uint32_t *)cmd_split_decoder->num_blocks;
    }
    else {
      local_b0 = (uint32_t *)cmd_split->lengths_alloc_size;
    }
    for (new_array_1 = local_b0; new_array_1 < (uint32_t *)cmd_split_decoder->num_blocks;
        new_array_1 = (uint32_t *)((long)new_array_1 << 1)) {
    }
    if (new_array_1 == (uint32_t *)0x0) {
      local_b8 = (uint32_t *)0x0;
    }
    else {
      local_b8 = (uint32_t *)BrotliAllocate(m,(long)new_array_1 << 2);
    }
    if (cmd_split->lengths_alloc_size != 0) {
      memcpy(local_b8,cmd_split->lengths,cmd_split->lengths_alloc_size << 2);
    }
    BrotliFree(m,cmd_split->lengths);
    cmd_split->lengths = (uint32_t *)0x0;
    cmd_split->lengths = local_b8;
    cmd_split->lengths_alloc_size = (size_t)new_array_1;
  }
  cmd_split->num_blocks = 0;
  cmd_split->num_types = 0;
  types_mapping = (int *)0x0;
  pvVar4 = malloc(cmd_split_decoder->num_types << 2);
  cmd.cmd_prefix_ = 0;
  cmd.dist_prefix_ = 0;
  for (; (ulong)(long)(int)cmd._12_4_ < cmd_split_decoder->num_types; cmd._12_4_ = cmd._12_4_ + 1) {
    *(undefined4 *)((long)pvVar4 + (long)(int)cmd._12_4_ * 4) = 0xffffffff;
  }
  cur_length = pos;
  for (cmd.dist_extra_ = 0; uVar1 = (uint32_t)types_mapping,
      (ulong)(long)(int)cmd.dist_extra_ < num_commands; cmd.dist_extra_ = cmd.dist_extra_ + 1) {
    if ((cmd_split_decoder->positions_end[*cur_block_decoder] <= cur_length) &&
       (types_mapping != (int *)0x0)) {
      if (*(int *)((long)pvVar4 + (ulong)cmd_split_decoder->types[*cur_block_decoder] * 4) == -1) {
        *(int *)((long)pvVar4 + (ulong)cmd_split_decoder->types[*cur_block_decoder] * 4) =
             (int)cmd_split->num_types;
      }
      if ((cmd_split->num_blocks == 0) ||
         (*(uint *)((long)pvVar4 + (ulong)cmd_split_decoder->types[*cur_block_decoder] * 4) !=
          (uint)cmd_split->types[cmd_split->num_blocks - 1])) {
        cmd_split->types[cmd_split->num_blocks] =
             (uint8_t)*(undefined4 *)
                       ((long)pvVar4 + (ulong)cmd_split_decoder->types[*cur_block_decoder] * 4);
        cmd_split->lengths[cmd_split->num_blocks] = uVar1;
        bVar2 = (byte)cmd_split->num_types;
        bVar3 = cmd_split->types[cmd_split->num_blocks] + 1;
        if (bVar3 < bVar2) {
          bVar3 = bVar2;
        }
        cmd_split->num_types = (ulong)bVar3;
        cmd_split->num_blocks = cmd_split->num_blocks + 1;
      }
      else {
        lVar5 = cmd_split->num_blocks - 1;
        cmd_split->lengths[lVar5] = cmd_split->lengths[lVar5] + uVar1;
      }
      types_mapping = (int *)0x0;
      *cur_block_decoder = *cur_block_decoder + 1;
    }
    while (cmd_split_decoder->positions_end[*cur_block_decoder] <= cur_length) {
      types_mapping = (int *)0x0;
      *cur_block_decoder = *cur_block_decoder + 1;
    }
    if ((cmd_split_decoder->positions_begin[*cur_block_decoder] <= cur_length) &&
       (cur_length < cmd_split_decoder->positions_end[*cur_block_decoder])) {
      types_mapping = (int *)((long)types_mapping + 1);
    }
    cur_length = (cmds[(int)cmd.dist_extra_].insert_len_ +
                 (cmds[(int)cmd.dist_extra_].copy_len_ & 0x1ffffff)) + cur_length;
  }
  if (types_mapping != (int *)0x0) {
    if (*(int *)((long)pvVar4 + (ulong)cmd_split_decoder->types[*cur_block_decoder] * 4) == -1) {
      *(int *)((long)pvVar4 + (ulong)cmd_split_decoder->types[*cur_block_decoder] * 4) =
           (int)cmd_split->num_types;
    }
    if ((cmd_split->num_blocks == 0) ||
       (*(uint *)((long)pvVar4 + (ulong)cmd_split_decoder->types[*cur_block_decoder] * 4) !=
        (uint)cmd_split->types[cmd_split->num_blocks - 1])) {
      cmd_split->types[cmd_split->num_blocks] =
           (uint8_t)*(undefined4 *)
                     ((long)pvVar4 + (ulong)cmd_split_decoder->types[*cur_block_decoder] * 4);
      cmd_split->lengths[cmd_split->num_blocks] = uVar1;
      bVar2 = (byte)cmd_split->num_types;
      bVar3 = cmd_split->types[cmd_split->num_blocks] + 1;
      if (bVar3 < bVar2) {
        bVar3 = bVar2;
      }
      cmd_split->num_types = (ulong)bVar3;
      cmd_split->num_blocks = cmd_split->num_blocks + 1;
    }
    else {
      lVar5 = cmd_split->num_blocks - 1;
      cmd_split->lengths[lVar5] = cmd_split->lengths[lVar5] + uVar1;
    }
  }
  return;
}

Assistant:

void BrotliSplitBlockCommandsFromStored(
                        MemoryManager* m,
                        const Command* cmds,
                        const size_t num_commands,
                        const size_t pos,
                        const size_t mask,
                        BlockSplit* cmd_split,
                        const BlockSplitFromDecoder* cmd_split_decoder,
                        size_t* cur_block_decoder) {
    BROTLI_ENSURE_CAPACITY(
        m, uint8_t, cmd_split->types, cmd_split->types_alloc_size,
        cmd_split_decoder->num_blocks);
    BROTLI_ENSURE_CAPACITY(
        m, uint32_t, cmd_split->lengths, cmd_split->lengths_alloc_size,
        cmd_split_decoder->num_blocks);
    size_t cur_pos = pos;
    cmd_split->num_blocks = 0;
    cmd_split->num_types = 0;
    size_t cur_length = 0;
    /* Mapping of the types from decoder (they increase with each metablock)
       to the appropriate types */
    int* types_mapping = (int*)malloc(sizeof(int) * cmd_split_decoder->num_types);
    for (int i = 0; i < cmd_split_decoder->num_types; ++i) {
      types_mapping[i] = -1;
    }
    for (int i = 0; i < num_commands; ++i) {
      const Command cmd = cmds[i];
      /* If current command lies after the current block
         that means we've finished the current block.
         If some commands have fallen inside current block before
         then need to save it*/
      if (cur_pos >= cmd_split_decoder->positions_end[*cur_block_decoder] &&
            cur_length > 0) {
        /* If we haven't seen this decoder block type before
          then save a mapping of it to a current num_types */
        if (types_mapping[cmd_split_decoder->types[*cur_block_decoder]] == -1) {
          types_mapping[cmd_split_decoder->types[*cur_block_decoder]] =
                                                          cmd_split->num_types;
        }
        /* If the same block type as for a previous block then merge them */
        if (cmd_split->num_blocks > 0 &&
            types_mapping[cmd_split_decoder->types[*cur_block_decoder]] ==
              cmd_split->types[cmd_split->num_blocks - 1]) {
            cmd_split->lengths[cmd_split->num_blocks - 1] += cur_length;
        } else {
          /* Map the decoder block type to an appropriate type */
          cmd_split->types[cmd_split->num_blocks] =
                    types_mapping[cmd_split_decoder->types[*cur_block_decoder]];
          cmd_split->lengths[cmd_split->num_blocks] = cur_length;
          cmd_split->num_types = BROTLI_MAX(uint8_t, cmd_split->num_types,
                                  cmd_split->types[cmd_split->num_blocks] + 1);
          cmd_split->num_blocks++;
        }
        cur_length = 0;
        (*cur_block_decoder)++;
      }
      /* Go through decoder blocks until a block with cur_pos inside is found */
      while (cur_pos >= cmd_split_decoder->positions_end[*cur_block_decoder]) {
        cur_length = 0;
        (*cur_block_decoder)++;
      }
      /* If command lies inside current block then
         increase an amount of commands inside current block*/
      if (cur_pos >= cmd_split_decoder->positions_begin[*cur_block_decoder] &&
          cur_pos < cmd_split_decoder->positions_end[*cur_block_decoder]) {
        cur_length++;
      } else {
        // TODO: log that back refs are wrong
      }
      /* Shift cur_pos by the amount of symbols representing a command */
      cur_pos += cmds[i].insert_len_ + CommandCopyLen(&cmds[i]);
    }
    /* Save the last in metablock block */
    if (cur_length > 0) {
      if (types_mapping[cmd_split_decoder->types[*cur_block_decoder]] == -1) {
        types_mapping[cmd_split_decoder->types[*cur_block_decoder]] =
                                                            cmd_split->num_types;
      }
      /* If the same block type as for a previous block then merge them */
      if (cmd_split->num_blocks > 0 &&
          types_mapping[cmd_split_decoder->types[*cur_block_decoder]] ==
            cmd_split->types[cmd_split->num_blocks - 1]) {
          cmd_split->lengths[cmd_split->num_blocks - 1] += cur_length;
      } else {
        cmd_split->types[cmd_split->num_blocks] =
                      types_mapping[cmd_split_decoder->types[*cur_block_decoder]];
        cmd_split->lengths[cmd_split->num_blocks] = cur_length;
        cmd_split->num_types = BROTLI_MAX(uint8_t, cmd_split->num_types,
                                      cmd_split->types[cmd_split->num_blocks] + 1);
        cmd_split->num_blocks++;
      }
    }
}